

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O3

void __thiscall helics::Federate::enterInitializingModeIterative(Federate *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Modes MVar3;
  element_type *peVar4;
  int iVar5;
  _Alloc_hider _Var6;
  int *piVar7;
  ulong extraout_RAX;
  InvalidFunctionCall *this_00;
  string_view message;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  cmd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  timespec local_70 [4];
  
  MVar3 = (this->currentMode)._M_i;
  if (MVar3 == PENDING_ITERATIVE_INIT) {
    enterInitializingModeIterativeComplete(this);
    return;
  }
  if (MVar3 != STARTUP) {
    this_00 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
    message._M_str = "cannot call iterative initialization from current state";
    message._M_len = 0x37;
    InvalidFunctionCall::InvalidFunctionCall(this_00,message);
    __cxa_throw(this_00,&InvalidFunctionCall::typeinfo,HelicsException::~HelicsException);
  }
  if ((this->hasPotentialInterfaces != true) ||
     ((this->potManager)._M_t.
      super___uniq_ptr_impl<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
      ._M_t.
      super__Tuple_impl<0UL,_helics::PotentialInterfacesManager_*,_std::default_delete<helics::PotentialInterfacesManager>_>
      .super__Head_base<0UL,_helics::PotentialInterfacesManager_*,_false>._M_head_impl ==
      (PotentialInterfacesManager *)0x0)) {
LAB_001c19d2:
    peVar4 = (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar4->_vptr_Core[0x13])(peVar4,(ulong)(uint)(this->fedID).fid,1);
    return;
  }
  iVar5 = (this->potInterfacesSequence).super___atomic_base<int>._M_i;
  if (iVar5 != 2) {
    if (iVar5 == 0) {
      PotentialInterfacesManager::initialize
                ((this->potManager)._M_t.
                 super___uniq_ptr_impl<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::PotentialInterfacesManager_*,_std::default_delete<helics::PotentialInterfacesManager>_>
                 .super__Head_base<0UL,_helics::PotentialInterfacesManager_*,_false>._M_head_impl);
      peVar4 = (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      (*peVar4->_vptr_Core[0x13])(peVar4,(ulong)(uint)(this->fedID).fid,1);
      LOCK();
      (this->potInterfacesSequence).super___atomic_base<int>._M_i = 2;
      UNLOCK();
      return;
    }
    goto LAB_001c19d2;
  }
  peVar4 = (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar4->_vptr_Core[0x13])(peVar4,(ulong)(uint)(this->fedID).fid,1);
  peVar4 = (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar4->_vptr_Core[0x5c])(&local_130,peVar4,(ulong)(uint)(this->fedID).fid);
  _Var6._M_p = (pointer)local_130._M_string_length;
  if ((pointer)local_130._M_string_length == (pointer)0x0) {
    local_70[0].tv_sec = 0;
    local_70[0].tv_nsec = 200000000;
    do {
      iVar5 = nanosleep(local_70,local_70);
      if (iVar5 != -1) break;
      piVar7 = __errno_location();
    } while (*piVar7 == 4);
    peVar4 = (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar4->_vptr_Core[0x5c])(local_70,peVar4,(ulong)(uint)(this->fedID).fid);
    enterInitializingModeIterative();
    _Var6._M_p = local_b0._M_dataplus._M_p;
    if ((extraout_RAX & 1) != 0) goto LAB_001c1b99;
  }
  paVar1 = &local_f0.first.field_2;
  paVar2 = &local_f0.second.field_2;
  do {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p == &local_130.field_2) {
      local_f0.first.field_2._8_8_ = local_130.field_2._8_8_;
      local_f0.first._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_f0.first._M_dataplus._M_p = local_130._M_dataplus._M_p;
    }
    local_f0.first.field_2._M_allocated_capacity._1_7_ =
         local_130.field_2._M_allocated_capacity._1_7_;
    local_f0.first.field_2._M_local_buf[0] = local_130.field_2._M_local_buf[0];
    local_130._M_string_length = 0;
    local_130.field_2._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p == &local_110.field_2) {
      local_f0.second.field_2._8_8_ = local_110.field_2._8_8_;
      local_f0.second._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_f0.second._M_dataplus._M_p = local_110._M_dataplus._M_p;
    }
    local_f0.second.field_2._M_allocated_capacity._1_7_ =
         local_110.field_2._M_allocated_capacity._1_7_;
    local_f0.second.field_2._M_local_buf[0] = local_110.field_2._M_local_buf[0];
    local_f0.second._M_string_length = local_110._M_string_length;
    local_110._M_string_length = 0;
    local_110.field_2._M_local_buf[0] = '\0';
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    local_f0.first._M_string_length = (size_type)_Var6._M_p;
    PotentialInterfacesManager::processCommand
              ((this->potManager)._M_t.
               super___uniq_ptr_impl<helics::PotentialInterfacesManager,_std::default_delete<helics::PotentialInterfacesManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::PotentialInterfacesManager_*,_std::default_delete<helics::PotentialInterfacesManager>_>
               .super__Head_base<0UL,_helics::PotentialInterfacesManager_*,_false>._M_head_impl,
               &local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0.second._M_dataplus._M_p != paVar2) {
      operator_delete(local_f0.second._M_dataplus._M_p,
                      local_f0.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_f0.first._M_dataplus._M_p,
                      local_f0.first.field_2._M_allocated_capacity + 1);
    }
    peVar4 = (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar4->_vptr_Core[0x5c])(&local_b0,peVar4,(ulong)(uint)(this->fedID).fid);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_130,&local_b0);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_110,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    _Var6._M_p = (pointer)local_130._M_string_length;
  } while ((pointer)local_130._M_string_length != (pointer)0x0);
LAB_001c1b99:
  LOCK();
  (this->potInterfacesSequence).super___atomic_base<int>._M_i = 3;
  UNLOCK();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,
                    CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                             local_110.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p == &local_130.field_2) {
    return;
  }
  operator_delete(local_130._M_dataplus._M_p,
                  CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                           local_130.field_2._M_local_buf[0]) + 1);
  return;
}

Assistant:

void Federate::enterInitializingModeIterative()
{
    auto cmode = currentMode.load();
    switch (cmode) {
        case Modes::STARTUP:
            try {
                if (hasPotentialInterfaces && potManager) {
                    switch (potInterfacesSequence.load()) {
                        case 0:
                            potManager->initialize();
                            coreObject->enterInitializingMode(
                                fedID, helics::IterationRequest::FORCE_ITERATION);
                            potInterfacesSequence.store(2);
                            break;
                        case 2: {
                            // respond to query
                            coreObject->enterInitializingMode(
                                fedID, helics::IterationRequest::FORCE_ITERATION);
                            // now check for commands
                            auto cmd = coreObject->getCommand(fedID);
                            if (cmd.first.empty()) {
                                std::this_thread::sleep_for(std::chrono::milliseconds(200));
                                cmd = coreObject->getCommand(fedID);
                            }
                            while (!cmd.first.empty()) {
                                potManager->processCommand(std::move(cmd));
                                cmd = coreObject->getCommand(fedID);
                            }
                            potInterfacesSequence.store(3);
                        } break;
                        default:
                            coreObject->enterInitializingMode(
                                fedID, helics::IterationRequest::FORCE_ITERATION);
                            break;
                    }
                } else {
                    coreObject->enterInitializingMode(fedID, IterationRequest::FORCE_ITERATION);
                }
            }
            catch (const HelicsException&) {
                updateFederateMode(Modes::ERROR_STATE);
                throw;
            }
            break;
        case Modes::PENDING_ITERATIVE_INIT:
            enterInitializingModeIterativeComplete();
            break;
        default:
            throw(InvalidFunctionCall("cannot call iterative initialization from current state"));
    }
}